

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  double dVar2;
  ulong uVar3;
  _func_int **pp_Var4;
  char *pcVar5;
  typed_value<bool,_char> *ptVar6;
  typed_value<unsigned_int,_char> *ptVar7;
  typed_value<pgi::PolicyInitialization,_char> *ptVar8;
  typed_value<unsigned_long,_char> *ptVar9;
  typed_value<int,_char> *ptVar10;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar11;
  options_description *poVar12;
  size_type sVar13;
  bool *pbVar14;
  ostream *poVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  _func_int **pp_Var17;
  uint *puVar18;
  JointPolicy *jp_00;
  DecPOMDPDiscrete *decpomdp_00;
  variable_value *rng_00;
  void *pvVar19;
  size_t sVar20;
  undefined8 *in_RSI;
  int in_EDI;
  ostringstream ss_1;
  ofstream fs_2;
  ofstream fs_3;
  size_t agent_2;
  rep duration;
  time_point t3;
  ImprovementResult bp;
  BackPassProperties backprops;
  time_point t1;
  int i;
  ofstream fs;
  ofstream fs_1;
  size_t agent_1;
  double best_value;
  JointPolicy jp;
  HistoryCache cache;
  ofstream ftime;
  ofstream fvalue;
  ostringstream ss;
  size_t agent;
  JointObservationSpace *jos;
  JointActionSpace *jas;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  local_policy_graphs;
  PRNG rng;
  belief_t initial_belief;
  DecPOMDPDiscrete decpomdp;
  MADPDecPOMDPDiscrete madp;
  variables_map vm;
  options_description cmdline_options;
  options_description hidden;
  positional_options_description pp;
  options_description config;
  PolicyInitialization policy_initialization;
  size_t max_history_cache_size;
  size_t blind_policy_initial_joint_action;
  int improvement_steps;
  uint width;
  uint horizon;
  uint rng_seed;
  string *in_stack_ffffffffffffd2d8;
  JointPolicy *name;
  DecPOMDPDiscrete *in_stack_ffffffffffffd2e0;
  adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
  *in_stack_ffffffffffffd2e8;
  ostream *in_stack_ffffffffffffd2f0;
  undefined7 in_stack_ffffffffffffd2f8;
  _Setfill<char> in_stack_ffffffffffffd2ff;
  JointPolicy *in_stack_ffffffffffffd300;
  undefined4 in_stack_ffffffffffffd308;
  _Setw in_stack_ffffffffffffd30c;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *in_stack_ffffffffffffd310;
  PolicyGraph *in_stack_ffffffffffffd318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd320;
  variable_value *in_stack_ffffffffffffd328;
  JointActionSpace *in_stack_ffffffffffffd330;
  allocator *paVar21;
  JointObservationSpace *in_stack_ffffffffffffd338;
  JointPolicy *in_stack_ffffffffffffd340;
  StateSpace *in_stack_ffffffffffffd348;
  DecPOMDPDiscrete *in_stack_ffffffffffffd350;
  basic_command_line_parser<char> *in_stack_ffffffffffffd358;
  unique_ptr<pgi::RewardInterface,_std::default_delete<pgi::RewardInterface>_>
  *in_stack_ffffffffffffd360;
  MADPDecPOMDPDiscrete *in_stack_ffffffffffffd368;
  HistoryCache *in_stack_ffffffffffffd390;
  DecPOMDPDiscrete *in_stack_ffffffffffffd398;
  History *in_stack_ffffffffffffd3a0;
  joint_vertex_t in_stack_ffffffffffffd3a8;
  JointPolicy *in_stack_ffffffffffffd3b0;
  size_t in_stack_ffffffffffffd3e0;
  HistoryData *in_stack_ffffffffffffd3e8;
  TreeCache<pgi::ActionObservation,_pgi::HistoryData> *in_stack_ffffffffffffd3f0;
  DecPOMDPDiscrete *in_stack_ffffffffffffd440;
  belief_t *in_stack_ffffffffffffd448;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  *in_stack_ffffffffffffd450;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
  *in_stack_ffffffffffffd468;
  JointPolicy *in_stack_ffffffffffffd470;
  size_t in_stack_ffffffffffffd4c0;
  size_t in_stack_ffffffffffffd4c8;
  size_t in_stack_ffffffffffffd4d0;
  undefined8 in_stack_ffffffffffffd4d8;
  HistoryCache *cache_00;
  DecPOMDPDiscrete *in_stack_ffffffffffffd5d0;
  string *in_stack_ffffffffffffd5d8;
  undefined4 in_stack_ffffffffffffd5e0;
  uint in_stack_ffffffffffffd5e4;
  bool local_28d9;
  string local_2750 [39];
  char local_2729;
  int local_2728;
  allocator local_2721;
  string local_2720 [32];
  ostringstream local_2700 [383];
  allocator local_2581;
  string local_2580 [32];
  string local_2560 [32];
  undefined1 local_2540 [560];
  string local_2310 [39];
  allocator local_22e9;
  string local_22e8 [32];
  string local_22c8 [32];
  string local_22a8 [32];
  string local_2288 [32];
  undefined1 local_2268 [512];
  ulong local_2068;
  rep local_2060;
  duration<long,_std::ratio<1L,_1000000L>_> local_2058;
  rep local_2050;
  undefined8 local_2048;
  double local_1f30;
  allocator local_1f21;
  string local_1f20 [32];
  BackPassProperties local_1f00;
  undefined8 local_1ee8;
  int local_1ee0;
  allocator local_1ed9;
  string local_1ed8 [32];
  string local_1eb8 [32];
  undefined1 local_1e98 [560];
  string local_1c68 [39];
  allocator local_1c41;
  string local_1c40 [32];
  string local_1c20 [32];
  string local_1c00 [32];
  string local_1be0 [32];
  undefined1 local_1bc0 [512];
  ulong local_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  double local_1998;
  JointPolicy local_1990;
  undefined8 local_1908;
  undefined8 local_1900;
  undefined8 local_18f8;
  undefined1 local_1859 [33];
  string local_1838 [32];
  undefined1 local_1818 [519];
  allocator local_1611;
  string local_1610 [32];
  string local_15f0 [32];
  undefined1 local_15d0 [512];
  string local_13d0 [39];
  char local_13a9;
  int local_13a8;
  allocator local_13a1;
  string local_13a0 [32];
  ostringstream local_1380 [383];
  allocator local_1201;
  string local_1200 [32];
  undefined1 local_11e0 [24];
  string local_11c8 [88];
  _func_int **local_1170;
  JointObservationSpace *local_1168;
  JointActionSpace *local_1160;
  allocator local_771;
  string local_770 [55];
  allocator local_739;
  string local_738 [32];
  undefined1 local_718 [16];
  string local_708 [47];
  allocator local_6d9;
  string local_6d8 [240];
  DecPOMDPDiscrete local_5e8;
  allocator local_501;
  string local_500 [39];
  allocator local_4d9;
  string local_4d8 [39];
  allocator local_4b1;
  string local_4b0 [47];
  allocator local_481;
  string local_480 [32];
  undefined4 local_460;
  allocator local_459;
  string local_458 [152];
  basic_parsed_options local_3c0 [40];
  variables_map local_398 [160];
  options_description local_2f8 [128];
  undefined8 local_278;
  allocator local_269;
  string local_268 [32];
  options_description local_248 [128];
  positional_options_description local_1c8 [56];
  undefined8 local_190;
  allocator local_181;
  string local_180 [36];
  undefined4 local_15c;
  undefined1 local_157;
  undefined1 local_156;
  undefined1 local_155;
  undefined4 local_154;
  undefined8 local_150;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_140;
  undefined1 local_139;
  undefined8 local_138 [3];
  allocator local_119;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  options_description local_b8 [132];
  int local_34;
  int local_20;
  int local_8;
  int local_4;
  
  local_4 = 0;
  pcVar5 = (char *)*in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,pcVar5,&local_119);
  std::operator+((char *)in_stack_ffffffffffffd2e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd2e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffd2e8,(char *)in_stack_ffffffffffffd2e0);
  boost::program_options::options_description::options_description
            (local_b8,local_d8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  local_138[0] = boost::program_options::options_description::add_options();
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_138,"help");
  boost::program_options::bool_switch();
  local_139 = 0;
  ptVar6 = boost::program_options::typed_value<bool,_char>::default_value
                     ((typed_value<bool,_char> *)in_stack_ffffffffffffd310,
                      (bool *)CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308));
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"verbose,v",(char *)ptVar6);
  boost::program_options::value<unsigned_int>((uint *)in_stack_ffffffffffffd2f0);
  local_140 = 3;
  ptVar7 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)in_stack_ffffffffffffd310,
                      (uint *)CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308));
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"horizon,h",(char *)ptVar7);
  boost::program_options::value<unsigned_int>((uint *)in_stack_ffffffffffffd2f0);
  local_144 = 3;
  ptVar7 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)in_stack_ffffffffffffd310,
                      (uint *)CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308));
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"policy-width,w",(char *)ptVar7);
  boost::program_options::value<pgi::PolicyInitialization>
            ((PolicyInitialization *)in_stack_ffffffffffffd2f0);
  local_148 = 0;
  ptVar8 = boost::program_options::typed_value<pgi::PolicyInitialization,_char>::default_value
                     ((typed_value<pgi::PolicyInitialization,_char> *)in_stack_ffffffffffffd310,
                      (PolicyInitialization *)
                      CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308));
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"policy-initialization,p",(char *)ptVar8);
  boost::program_options::value<unsigned_long>((unsigned_long *)in_stack_ffffffffffffd2f0);
  local_150 = 0;
  ptVar9 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     ((typed_value<unsigned_long,_char> *)in_stack_ffffffffffffd310,
                      (unsigned_long *)
                      CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308));
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"blind-action,b",(char *)ptVar9);
  boost::program_options::value<int>((int *)in_stack_ffffffffffffd2f0);
  local_154 = 9;
  ptVar10 = boost::program_options::typed_value<int,_char>::default_value
                      ((typed_value<int,_char> *)in_stack_ffffffffffffd310,
                       (int *)CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308));
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"improvement-steps,i",(char *)ptVar10);
  boost::program_options::bool_switch();
  local_155 = 0;
  ptVar6 = boost::program_options::typed_value<bool,_char>::default_value
                     ((typed_value<bool,_char> *)in_stack_ffffffffffffd310,
                      (bool *)CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308));
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"use-lower-bound,l",(char *)ptVar6);
  boost::program_options::bool_switch();
  local_156 = 0;
  ptVar6 = boost::program_options::typed_value<bool,_char>::default_value
                     ((typed_value<bool,_char> *)in_stack_ffffffffffffd310,
                      (bool *)CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308));
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"use-entropy-reward,e",(char *)ptVar6);
  boost::program_options::bool_switch();
  local_157 = 0;
  ptVar6 = boost::program_options::typed_value<bool,_char>::default_value
                     ((typed_value<bool,_char> *)in_stack_ffffffffffffd310,
                      (bool *)CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308));
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"use-sparse,t",(char *)ptVar6);
  boost::program_options::value<unsigned_int>((uint *)in_stack_ffffffffffffd2f0);
  local_15c = 0x499602d2;
  ptVar7 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)in_stack_ffffffffffffd310,
                      (uint *)CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308));
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"seed,s",(char *)ptVar7);
  boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"./",&local_181);
  ptVar11 = boost::program_options::
            typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
            ::default_value(in_stack_ffffffffffffd310,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308));
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"output-prefix,o",(char *)ptVar11);
  boost::program_options::value<unsigned_long>((unsigned_long *)in_stack_ffffffffffffd2f0);
  local_190 = 50000000;
  ptVar9 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     ((typed_value<unsigned_long,_char> *)in_stack_ffffffffffffd310,
                      (unsigned_long *)
                      CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308));
  boost::program_options::options_description_easy_init::operator()
            (pcVar5,(value_semantic *)"max-cache-size,m",(char *)ptVar9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  boost::program_options::positional_options_description::positional_options_description(local_1c8);
  boost::program_options::positional_options_description::add((char *)local_1c8,0x3462ae);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"Hidden options",&local_269);
  boost::program_options::options_description::options_description
            (local_248,local_268,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  local_278 = boost::program_options::options_description::add_options();
  ptVar11 = boost::program_options::value<std::__cxx11::string>();
  boost::program_options::options_description_easy_init::operator()
            ((char *)&local_278,(value_semantic *)"dpomdp-file",(char *)ptVar11);
  boost::program_options::options_description::options_description
            (local_2f8,(uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  poVar12 = (options_description *)boost::program_options::options_description::add(local_2f8);
  boost::program_options::options_description::add(poVar12);
  boost::program_options::variables_map::variables_map(local_398);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)in_stack_ffffffffffffd350,
             (int)((ulong)in_stack_ffffffffffffd348 >> 0x20),(char **)in_stack_ffffffffffffd340);
  boost::program_options::basic_command_line_parser<char>::options
            ((basic_command_line_parser<char> *)in_stack_ffffffffffffd2e0,
             (options_description *)in_stack_ffffffffffffd2d8);
  boost::program_options::basic_command_line_parser<char>::positional
            ((basic_command_line_parser<char> *)in_stack_ffffffffffffd2e0,
             (positional_options_description *)in_stack_ffffffffffffd2d8);
  boost::program_options::basic_command_line_parser<char>::run(in_stack_ffffffffffffd358);
  boost::program_options::store(local_3c0,local_398,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x29d6a8);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser
            ((basic_command_line_parser<char> *)0x29d6b5);
  boost::program_options::notify(local_398);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"help",&local_459);
  sVar13 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)in_stack_ffffffffffffd2f0,(key_type *)in_stack_ffffffffffffd2e8);
  local_28d9 = sVar13 == 0 && local_8 != 1;
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  if (local_28d9) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_480,"dpomdp-file",&local_481);
    sVar13 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)in_stack_ffffffffffffd2f0,(key_type *)in_stack_ffffffffffffd2e8);
    std::__cxx11::string::~string(local_480);
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
    if (sVar13 == 0) {
      poVar15 = std::operator<<((ostream *)&std::cout,"You must specify an input dpomdp file");
      std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      local_4 = 1;
      local_460 = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4b0,"dpomdp-file",&local_4b1);
      boost::program_options::variables_map::operator[]
                ((variables_map *)in_stack_ffffffffffffd2e0,in_stack_ffffffffffffd2d8);
      boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x29dba0);
      pgi::madpwrapper::MADPDecPOMDPDiscrete::MADPDecPOMDPDiscrete
                ((MADPDecPOMDPDiscrete *)in_stack_ffffffffffffd300,
                 (string *)CONCAT17(in_stack_ffffffffffffd2ff._M_c,in_stack_ffffffffffffd2f8));
      std::__cxx11::string::~string(local_4b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4d8,"verbose",&local_4d9);
      boost::program_options::variables_map::operator[]
                ((variables_map *)in_stack_ffffffffffffd2e0,in_stack_ffffffffffffd2d8);
      pbVar14 = boost::program_options::variable_value::as<bool>((variable_value *)0x29dc3a);
      bVar1 = *pbVar14;
      std::__cxx11::string::~string(local_4d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
      if ((bVar1 & 1U) != 0) {
        poVar15 = std::operator<<((ostream *)&std::cout,"Loaded problem file ");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_500,"dpomdp-file",&local_501);
        boost::program_options::variables_map::operator[]
                  ((variables_map *)in_stack_ffffffffffffd2e0,in_stack_ffffffffffffd2d8);
        pbVar16 = boost::program_options::variable_value::as<std::__cxx11::string>
                            ((variable_value *)0x29dcfa);
        poVar15 = std::operator<<(poVar15,(string *)pbVar16);
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_500);
        std::allocator<char>::~allocator((allocator<char> *)&local_501);
      }
      pgi::make_state_space(in_stack_ffffffffffffd368);
      pgi::make_joint_action_space((MADPDecPOMDPDiscrete *)in_stack_ffffffffffffd358);
      pgi::make_joint_observation_space((MADPDecPOMDPDiscrete *)in_stack_ffffffffffffd358);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6d8,"use-sparse",&local_6d9);
      boost::program_options::variables_map::operator[]
                ((variables_map *)in_stack_ffffffffffffd2e0,in_stack_ffffffffffffd2d8);
      boost::program_options::variable_value::as<bool>((variable_value *)0x29def0);
      pgi::make_transition_matrix
                ((MADPDecPOMDPDiscrete *)in_stack_ffffffffffffd358,
                 SUB81((ulong)in_stack_ffffffffffffd350 >> 0x38,0));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_708,"use-sparse",(allocator *)(local_718 + 0xf));
      boost::program_options::variables_map::operator[]
                ((variables_map *)in_stack_ffffffffffffd2e0,in_stack_ffffffffffffd2d8);
      boost::program_options::variable_value::as<bool>((variable_value *)0x29df7e);
      pgi::make_observation_matrix
                ((MADPDecPOMDPDiscrete *)in_stack_ffffffffffffd358,
                 SUB81((ulong)in_stack_ffffffffffffd350 >> 0x38,0));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_738,"use-entropy-reward",&local_739);
      boost::program_options::variables_map::operator[]
                ((variables_map *)in_stack_ffffffffffffd2e0,in_stack_ffffffffffffd2d8);
      boost::program_options::variable_value::as<bool>((variable_value *)0x29e00c);
      pgi::make_reward_matrix
                ((MADPDecPOMDPDiscrete *)in_stack_ffffffffffffd338,
                 SUB81((ulong)in_stack_ffffffffffffd330 >> 0x38,0));
      name = (JointPolicy *)local_718;
      pgi::DecPOMDPDiscrete::DecPOMDPDiscrete
                (in_stack_ffffffffffffd350,in_stack_ffffffffffffd348,
                 (JointActionSpace *)in_stack_ffffffffffffd340,in_stack_ffffffffffffd338,
                 (unique_ptr<pgi::StateTransitionInterface,_std::default_delete<pgi::StateTransitionInterface>_>
                  *)in_stack_ffffffffffffd330,
                 (unique_ptr<pgi::ObservationInterface,_std::default_delete<pgi::ObservationInterface>_>
                  *)in_stack_ffffffffffffd328,in_stack_ffffffffffffd360);
      std::unique_ptr<pgi::RewardInterface,_std::default_delete<pgi::RewardInterface>_>::~unique_ptr
                ((unique_ptr<pgi::RewardInterface,_std::default_delete<pgi::RewardInterface>_> *)
                 in_stack_ffffffffffffd2e0);
      std::__cxx11::string::~string(local_738);
      std::allocator<char>::~allocator((allocator<char> *)&local_739);
      std::unique_ptr<pgi::ObservationInterface,_std::default_delete<pgi::ObservationInterface>_>::
      ~unique_ptr((unique_ptr<pgi::ObservationInterface,_std::default_delete<pgi::ObservationInterface>_>
                   *)in_stack_ffffffffffffd2e0);
      std::__cxx11::string::~string(local_708);
      std::allocator<char>::~allocator((allocator<char> *)(local_718 + 0xf));
      std::
      unique_ptr<pgi::StateTransitionInterface,_std::default_delete<pgi::StateTransitionInterface>_>
      ::~unique_ptr((unique_ptr<pgi::StateTransitionInterface,_std::default_delete<pgi::StateTransitionInterface>_>
                     *)in_stack_ffffffffffffd2e0);
      std::__cxx11::string::~string(local_6d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
      pgi::JointDiscreteSpace<pgi::DiscreteObservation>::~JointDiscreteSpace
                ((JointDiscreteSpace<pgi::DiscreteObservation> *)in_stack_ffffffffffffd2e0);
      pgi::JointDiscreteSpace<pgi::DiscreteAction>::~JointDiscreteSpace
                ((JointDiscreteSpace<pgi::DiscreteAction> *)in_stack_ffffffffffffd2e0);
      pgi::DiscreteSpace<pgi::DiscreteState>::~DiscreteSpace
                ((DiscreteSpace<pgi::DiscreteState> *)0x29e11c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_770,"use-sparse",&local_771);
      boost::program_options::variables_map::operator[]
                ((variables_map *)in_stack_ffffffffffffd2e0,(string *)name);
      boost::program_options::variable_value::as<bool>((variable_value *)0x29e17b);
      pgi::make_initial_belief
                ((MADPDecPOMDPDiscrete *)in_stack_ffffffffffffd348,
                 SUB81((ulong)in_stack_ffffffffffffd340 >> 0x38,0));
      std::__cxx11::string::~string(local_770);
      std::allocator<char>::~allocator((allocator<char> *)&local_771);
      pgi::PRNG::PRNG((PRNG *)in_stack_ffffffffffffd2e0,(uint)((ulong)name >> 0x20));
      std::
      vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
      ::vector((vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                *)0x29e1e7);
      local_1160 = pgi::DecPOMDPDiscrete::joint_action_space(&local_5e8);
      local_1168 = pgi::DecPOMDPDiscrete::joint_observation_space(&local_5e8);
      for (local_1170 = (_func_int **)0x0; pp_Var4 = local_1170,
          pp_Var17 = (_func_int **)pgi::DecPOMDPDiscrete::num_agents((DecPOMDPDiscrete *)0x29e25e),
          pp_Var4 < pp_Var17; local_1170 = (_func_int **)((long)local_1170 + 1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_11c8,"horizon",(allocator *)(local_11e0 + 0x17));
        boost::program_options::variables_map::operator[]
                  ((variables_map *)in_stack_ffffffffffffd2e0,(string *)name);
        puVar18 = boost::program_options::variable_value::as<unsigned_int>
                            ((variable_value *)0x29e2e0);
        in_stack_ffffffffffffd5e4 = *puVar18;
        pgi::IndexSpace<unsigned_long>::num_local_indices
                  ((IndexSpace<unsigned_long> *)in_stack_ffffffffffffd2e0,(unsigned_long)name);
        in_stack_ffffffffffffd5d8 =
             (string *)
             pgi::IndexSpace<unsigned_long>::num_local_indices
                       ((IndexSpace<unsigned_long> *)in_stack_ffffffffffffd2e0,(unsigned_long)name);
        pgi::fixed_width((uint)((ulong)in_stack_ffffffffffffd4d8 >> 0x20),in_stack_ffffffffffffd4d0,
                         in_stack_ffffffffffffd4c8,in_stack_ffffffffffffd4c0);
        std::
        vector<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>,std::allocator<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>>>
        ::
        emplace_back<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,unsigned_long,unsigned_long,pgi::PGProperties,boost::listS>>
                  ((vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                    *)in_stack_ffffffffffffd2f0,in_stack_ffffffffffffd2e8);
        boost::
        adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
        ::~adjacency_list((adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
                           *)in_stack_ffffffffffffd2e0);
        std::__cxx11::string::~string(local_11c8);
        std::allocator<char>::~allocator((allocator<char> *)(local_11e0 + 0x17));
      }
      if (local_34 == 0) {
        pgi::set_random((vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                         *)in_stack_ffffffffffffd300,
                        (PRNG *)CONCAT17(in_stack_ffffffffffffd2ff._M_c,in_stack_ffffffffffffd2f8));
      }
      else if (local_34 == 1) {
        in_stack_ffffffffffffd5d0 = (DecPOMDPDiscrete *)local_11e0;
        pgi::probability_mass_t<double,_long>::probability_mass_t
                  ((probability_mass_t<double,_long> *)in_stack_ffffffffffffd2e0,
                   (probability_mass_t<double,_long> *)name);
        pgi::set_open_loop_greedy
                  (in_stack_ffffffffffffd450,in_stack_ffffffffffffd448,in_stack_ffffffffffffd440);
        pgi::probability_mass_t<double,_long>::~probability_mass_t
                  ((probability_mass_t<double,_long> *)0x29e6a1);
      }
      else if (local_34 == 2) {
        pgi::set_random((vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                         *)in_stack_ffffffffffffd300,
                        (PRNG *)CONCAT17(in_stack_ffffffffffffd2ff._M_c,in_stack_ffffffffffffd2f8));
        pgi::DecPOMDPDiscrete::joint_action_space(&local_5e8);
        pgi::set_blind((vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                        *)in_stack_ffffffffffffd340,(size_t)in_stack_ffffffffffffd338,
                       in_stack_ffffffffffffd330);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1200,"verbose",&local_1201);
      boost::program_options::variables_map::operator[]
                ((variables_map *)in_stack_ffffffffffffd2e0,(string *)name);
      pbVar14 = boost::program_options::variable_value::as<bool>((variable_value *)0x29e798);
      bVar1 = *pbVar14;
      std::__cxx11::string::~string(local_1200);
      std::allocator<char>::~allocator((allocator<char> *)&local_1201);
      if ((bVar1 & 1U) != 0) {
        std::operator<<((ostream *)&std::cout,"Initialized policy using ");
        poVar15 = pgi::operator<<((ostream *)in_stack_ffffffffffffd2e0,(PolicyInitialization *)name)
        ;
        poVar15 = std::operator<<(poVar15," strategy");
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
      std::__cxx11::ostringstream::ostringstream(local_1380);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_13a0,"output-prefix",&local_13a1);
      boost::program_options::variables_map::operator[]
                ((variables_map *)in_stack_ffffffffffffd2e0,(string *)name);
      pbVar16 = boost::program_options::variable_value::as<std::__cxx11::string>
                          ((variable_value *)0x29e905);
      poVar15 = std::operator<<((ostream *)local_1380,(string *)pbVar16);
      poVar15 = std::operator<<(poVar15,"step");
      local_13a8 = (int)std::setw(3);
      poVar15 = std::operator<<(poVar15,(_Setw)local_13a8);
      local_13a9 = (char)std::setfill<char>('0');
      poVar15 = std::operator<<(poVar15);
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,0);
      std::operator<<(poVar15,"_");
      std::__cxx11::string::~string(local_13a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_13a1);
      std::__cxx11::ostringstream::str();
      write_policy_to_file
                ((vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                  *)CONCAT44(in_stack_ffffffffffffd5e4,in_stack_ffffffffffffd5e0),
                 in_stack_ffffffffffffd5d8,in_stack_ffffffffffffd5d0);
      std::__cxx11::string::~string(local_13d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1610,"output-prefix",&local_1611);
      jp_00 = (JointPolicy *)
              boost::program_options::variables_map::operator[]
                        ((variables_map *)in_stack_ffffffffffffd2e0,(string *)name);
      decpomdp_00 = (DecPOMDPDiscrete *)
                    boost::program_options::variable_value::as<std::__cxx11::string>
                              ((variable_value *)0x29eab6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308),
                     (char *)in_stack_ffffffffffffd300);
      std::ofstream::ofstream(local_15d0,local_15f0,_S_out);
      std::__cxx11::string::~string(local_15f0);
      std::__cxx11::string::~string(local_1610);
      std::allocator<char>::~allocator((allocator<char> *)&local_1611);
      cache_00 = (HistoryCache *)local_1859;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_1859 + 1),"output-prefix",(allocator *)cache_00)
      ;
      rng_00 = boost::program_options::variables_map::operator[]
                         ((variables_map *)in_stack_ffffffffffffd2e0,(string *)name);
      pbVar16 = boost::program_options::variable_value::as<std::__cxx11::string>
                          ((variable_value *)0x29eb80);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308),
                     (char *)in_stack_ffffffffffffd300);
      std::ofstream::ofstream(local_1818,local_1838,_S_out);
      std::__cxx11::string::~string(local_1838);
      std::__cxx11::string::~string((string *)(local_1859 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1859);
      local_1908 = 0x3ff0000000000000;
      local_1900 = 0;
      local_18f8 = 0;
      pgi::probability_mass_t<double,_long>::probability_mass_t
                ((probability_mass_t<double,_long> *)in_stack_ffffffffffffd2e0,
                 (probability_mass_t<double,_long> *)name);
      pgi::TreeCache<pgi::ActionObservation,_pgi::HistoryData>::TreeCache
                (in_stack_ffffffffffffd3f0,in_stack_ffffffffffffd3e8,in_stack_ffffffffffffd3e0);
      pgi::HistoryData::~HistoryData((HistoryData *)0x29ec56);
      pgi::JointPolicy::JointPolicy(in_stack_ffffffffffffd470,in_stack_ffffffffffffd468);
      pgi::JointPolicy::root(in_stack_ffffffffffffd340);
      local_19b8 = 0;
      uStack_19b0 = 0;
      local_19a8 = 0;
      std::vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>::vector
                ((vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_> *)0x29ecb0
                );
      dVar2 = pgi::value(in_stack_ffffffffffffd3b0,in_stack_ffffffffffffd3a8,
                         in_stack_ffffffffffffd3a0,in_stack_ffffffffffffd398,
                         in_stack_ffffffffffffd390);
      std::vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>::~vector
                ((vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_> *)
                 in_stack_ffffffffffffd2f0);
      local_1998 = dVar2;
      pvVar19 = (void *)std::ostream::operator<<(local_15d0,dVar2);
      std::ostream::operator<<(pvVar19,std::endl<char,std::char_traits<char>>);
      poVar15 = std::operator<<((ostream *)&std::cout,"Policy value: ");
      pvVar19 = (void *)std::ostream::operator<<(poVar15,local_1998);
      std::ostream::operator<<(pvVar19,std::endl<char,std::char_traits<char>>);
      poVar15 = std::operator<<((ostream *)&std::cout,"Stored ");
      sVar20 = pgi::TreeCache<pgi::ActionObservation,_pgi::HistoryData>::size
                         ((TreeCache<pgi::ActionObservation,_pgi::HistoryData> *)0x29edba);
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,sVar20);
      poVar15 = std::operator<<(poVar15," histories in cache");
      std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      for (local_19c0 = 0; uVar3 = local_19c0,
          sVar20 = pgi::DecPOMDPDiscrete::num_agents((DecPOMDPDiscrete *)0x29ee40), uVar3 < sVar20;
          local_19c0 = local_19c0 + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c40,"output-prefix",&local_1c41);
        boost::program_options::variables_map::operator[]
                  ((variables_map *)in_stack_ffffffffffffd2e0,(string *)name);
        boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x29eec2)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308),
                       (char *)in_stack_ffffffffffffd300);
        std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffd318);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd318,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd310);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffd2e8,(char *)in_stack_ffffffffffffd2e0);
        std::ofstream::ofstream(local_1bc0,local_1be0,_S_out);
        std::__cxx11::string::~string(local_1be0);
        std::__cxx11::string::~string(local_1c00);
        std::__cxx11::string::~string(local_1c68);
        std::__cxx11::string::~string(local_1c20);
        std::__cxx11::string::~string(local_1c40);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c41);
        pgi::JointPolicy::local_policy((JointPolicy *)in_stack_ffffffffffffd2e0,(size_t)name);
        pgi::DecPOMDPDiscrete::joint_action_space(&local_5e8);
        pgi::JointDiscreteSpace<pgi::DiscreteAction>::get
                  ((JointDiscreteSpace<pgi::DiscreteAction> *)in_stack_ffffffffffffd2e0,(size_t)name
                  );
        pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteAction>>
                  ((DiscreteSpace<pgi::DiscreteAction> *)in_stack_ffffffffffffd328);
        pgi::DecPOMDPDiscrete::joint_observation_space(&local_5e8);
        pgi::JointDiscreteSpace<pgi::DiscreteObservation>::get
                  ((JointDiscreteSpace<pgi::DiscreteObservation> *)in_stack_ffffffffffffd2e0,
                   (size_t)name);
        pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteObservation>>
                  ((DiscreteSpace<pgi::DiscreteObservation> *)in_stack_ffffffffffffd328);
        pgi::print((ostream *)in_stack_ffffffffffffd320,in_stack_ffffffffffffd318,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffd310,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffd2f0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffd2f0);
        std::ofstream::~ofstream(local_1bc0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1ed8,"output-prefix",&local_1ed9);
      boost::program_options::variables_map::operator[]
                ((variables_map *)in_stack_ffffffffffffd2e0,(string *)name);
      boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x29f44c);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308),
                     (char *)in_stack_ffffffffffffd300);
      std::ofstream::ofstream(local_1e98,local_1eb8,_S_out);
      std::__cxx11::string::~string(local_1eb8);
      std::__cxx11::string::~string(local_1ed8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1ed9);
      pvVar19 = (void *)std::ostream::operator<<(local_1e98,local_1998);
      std::ostream::operator<<(pvVar19,std::endl<char,std::char_traits<char>>);
      for (local_1ee0 = 1; local_1ee0 <= local_20; local_1ee0 = local_1ee0 + 1) {
        local_1ee8 = std::chrono::_V2::system_clock::now();
        paVar21 = &local_1f21;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f20,"use-lower-bound",paVar21);
        boost::program_options::variables_map::operator[]
                  ((variables_map *)in_stack_ffffffffffffd2e0,(string *)name);
        pbVar14 = boost::program_options::variable_value::as<bool>((variable_value *)0x29f578);
        pgi::backpass::BackPassProperties::BackPassProperties(&local_1f00,(bool)(*pbVar14 & 1));
        std::__cxx11::string::~string(local_1f20);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f21);
        pgi::JointPolicy::JointPolicy
                  (in_stack_ffffffffffffd300,
                   (JointPolicy *)CONCAT17(in_stack_ffffffffffffd2ff._M_c,in_stack_ffffffffffffd2f8)
                  );
        pgi::backpass::improve
                  (jp_00,decpomdp_00,cache_00,(PRNG *)rng_00,(BackPassProperties *)pbVar16);
        pgi::JointPolicy::~JointPolicy((JointPolicy *)in_stack_ffffffffffffd2e0);
        local_2048 = std::chrono::_V2::system_clock::now();
        local_2060 = (rep)std::chrono::operator-
                                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)in_stack_ffffffffffffd2e8,
                                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)in_stack_ffffffffffffd2e0);
        local_2058.__r =
             (rep)std::chrono::
                  duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                            ((duration<long,_std::ratio<1L,_1000000000L>_> *)name);
        local_2050 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_2058);
        pvVar19 = (void *)std::ostream::operator<<(local_1818,local_2050);
        std::ostream::operator<<(pvVar19,std::endl<char,std::char_traits<char>>);
        pvVar19 = (void *)std::ostream::operator<<(local_15d0,local_1f30);
        std::ostream::operator<<(pvVar19,std::endl<char,std::char_traits<char>>);
        if (local_1998 < local_1f30) {
          local_1998 = local_1f30;
          pgi::JointPolicy::operator=((JointPolicy *)in_stack_ffffffffffffd2e0,name);
          for (local_2068 = 0; uVar3 = local_2068,
              sVar20 = pgi::DecPOMDPDiscrete::num_agents((DecPOMDPDiscrete *)0x29f773),
              uVar3 < sVar20; local_2068 = local_2068 + 1) {
            paVar21 = &local_22e9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_22e8,"output-prefix",paVar21);
            boost::program_options::variables_map::operator[]
                      ((variables_map *)in_stack_ffffffffffffd2e0,(string *)name);
            boost::program_options::variable_value::as<std::__cxx11::string>
                      ((variable_value *)0x29f7f5);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308),
                           (char *)in_stack_ffffffffffffd300);
            std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffd318);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffd318,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffd310);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffd2e8,(char *)in_stack_ffffffffffffd2e0);
            std::ofstream::ofstream(local_2268,local_2288,_S_out);
            std::__cxx11::string::~string(local_2288);
            std::__cxx11::string::~string(local_22a8);
            std::__cxx11::string::~string(local_2310);
            std::__cxx11::string::~string(local_22c8);
            std::__cxx11::string::~string(local_22e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_22e9);
            pgi::JointPolicy::local_policy((JointPolicy *)in_stack_ffffffffffffd2e0,(size_t)name);
            pgi::DecPOMDPDiscrete::joint_action_space(&local_5e8);
            pgi::JointDiscreteSpace<pgi::DiscreteAction>::get
                      ((JointDiscreteSpace<pgi::DiscreteAction> *)in_stack_ffffffffffffd2e0,
                       (size_t)name);
            pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteAction>>
                      ((DiscreteSpace<pgi::DiscreteAction> *)in_stack_ffffffffffffd328);
            pgi::DecPOMDPDiscrete::joint_observation_space(&local_5e8);
            pgi::JointDiscreteSpace<pgi::DiscreteObservation>::get
                      ((JointDiscreteSpace<pgi::DiscreteObservation> *)in_stack_ffffffffffffd2e0,
                       (size_t)name);
            pgi::element_names<pgi::DiscreteSpace<pgi::DiscreteObservation>>
                      ((DiscreteSpace<pgi::DiscreteObservation> *)in_stack_ffffffffffffd328);
            pgi::print((ostream *)in_stack_ffffffffffffd320,in_stack_ffffffffffffd318,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffd310,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffd2f0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffd2f0);
            std::ofstream::~ofstream(local_2268);
          }
          paVar21 = &local_2581;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2580,"output-prefix",paVar21);
          boost::program_options::variables_map::operator[]
                    ((variables_map *)in_stack_ffffffffffffd2e0,(string *)name);
          boost::program_options::variable_value::as<std::__cxx11::string>
                    ((variable_value *)0x29fcae);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffd30c._M_n,in_stack_ffffffffffffd308),
                         (char *)in_stack_ffffffffffffd300);
          std::ofstream::ofstream(local_2540,local_2560,_S_out);
          std::__cxx11::string::~string(local_2560);
          std::__cxx11::string::~string(local_2580);
          std::allocator<char>::~allocator((allocator<char> *)&local_2581);
          pvVar19 = (void *)std::ostream::operator<<(local_2540,local_1998);
          std::ostream::operator<<(pvVar19,std::endl<char,std::char_traits<char>>);
          std::ofstream::~ofstream(local_2540);
        }
        poVar15 = std::operator<<((ostream *)&std::cout,"Step ");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_1ee0);
        poVar15 = std::operator<<(poVar15," of ");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_20);
        poVar15 = std::operator<<(poVar15,": ");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_1f30);
        poVar15 = std::operator<<(poVar15," (best: ");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_1998);
        poVar15 = std::operator<<(poVar15,")");
        poVar15 = std::operator<<(poVar15,", ");
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_2050);
        poVar15 = std::operator<<(poVar15," microseconds");
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::ostringstream(local_2700);
        paVar21 = &local_2721;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2720,"output-prefix",paVar21);
        in_stack_ffffffffffffd328 =
             boost::program_options::variables_map::operator[]
                       ((variables_map *)in_stack_ffffffffffffd2e0,(string *)name);
        in_stack_ffffffffffffd320 =
             boost::program_options::variable_value::as<std::__cxx11::string>
                       ((variable_value *)0x29ffbf);
        in_stack_ffffffffffffd318 =
             (PolicyGraph *)
             std::operator<<((ostream *)local_2700,(string *)in_stack_ffffffffffffd320);
        in_stack_ffffffffffffd310 =
             (typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
              *)std::operator<<((ostream *)in_stack_ffffffffffffd318,"/step");
        in_stack_ffffffffffffd30c = std::setw(3);
        local_2728 = in_stack_ffffffffffffd30c._M_n;
        in_stack_ffffffffffffd300 =
             (JointPolicy *)
             std::operator<<((ostream *)in_stack_ffffffffffffd310,in_stack_ffffffffffffd30c);
        in_stack_ffffffffffffd2ff = std::setfill<char>('0');
        local_2729 = in_stack_ffffffffffffd2ff._M_c;
        in_stack_ffffffffffffd2f0 =
             std::operator<<(in_stack_ffffffffffffd300,in_stack_ffffffffffffd2ff._M_c);
        in_stack_ffffffffffffd2e8 =
             (adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
              *)std::ostream::operator<<(in_stack_ffffffffffffd2f0,local_1ee0);
        std::operator<<((ostream *)in_stack_ffffffffffffd2e8,"_");
        std::__cxx11::string::~string(local_2720);
        std::allocator<char>::~allocator((allocator<char> *)&local_2721);
        in_stack_ffffffffffffd2e0 =
             (DecPOMDPDiscrete *)pgi::JointPolicy::local_policies(&local_1990);
        std::__cxx11::ostringstream::str();
        write_policy_to_file
                  ((vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                    *)CONCAT44(in_stack_ffffffffffffd5e4,in_stack_ffffffffffffd5e0),
                   in_stack_ffffffffffffd5d8,in_stack_ffffffffffffd5d0);
        std::__cxx11::string::~string(local_2750);
        pgi::TreeCache<pgi::ActionObservation,_pgi::HistoryData>::ensure_size_within_limits
                  ((TreeCache<pgi::ActionObservation,_pgi::HistoryData> *)in_stack_ffffffffffffd2e0)
        ;
        std::__cxx11::ostringstream::~ostringstream(local_2700);
        pgi::backpass::ImprovementResult::~ImprovementResult((ImprovementResult *)0x2a0120);
      }
      local_4 = 0;
      local_460 = 1;
      std::ofstream::~ofstream(local_1e98);
      pgi::JointPolicy::~JointPolicy((JointPolicy *)in_stack_ffffffffffffd2e0);
      pgi::TreeCache<pgi::ActionObservation,_pgi::HistoryData>::~TreeCache
                ((TreeCache<pgi::ActionObservation,_pgi::HistoryData> *)in_stack_ffffffffffffd2e0);
      std::ofstream::~ofstream(local_1818);
      std::ofstream::~ofstream(local_15d0);
      std::__cxx11::ostringstream::~ostringstream(local_1380);
      std::
      vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
      ::~vector((vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>_>_>
                 *)in_stack_ffffffffffffd2f0);
      pgi::probability_mass_t<double,_long>::~probability_mass_t
                ((probability_mass_t<double,_long> *)0x2a0250);
      pgi::DecPOMDPDiscrete::~DecPOMDPDiscrete(in_stack_ffffffffffffd2e0);
      pgi::madpwrapper::MADPDecPOMDPDiscrete::~MADPDecPOMDPDiscrete
                ((MADPDecPOMDPDiscrete *)0x2a026a);
    }
  }
  else {
    pvVar19 = (void *)boost::program_options::operator<<((ostream *)&std::cout,local_b8);
    std::ostream::operator<<(pvVar19,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
    local_460 = 1;
  }
  boost::program_options::variables_map::~variables_map((variables_map *)in_stack_ffffffffffffd2e0);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffd2e0);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffd2e0);
  boost::program_options::positional_options_description::~positional_options_description
            ((positional_options_description *)in_stack_ffffffffffffd2e0);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_ffffffffffffd2e0);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  unsigned int rng_seed;
  unsigned int horizon;
  unsigned int width;
  int improvement_steps;
  std::size_t blind_policy_initial_joint_action;
  std::size_t max_history_cache_size;
  pgi::PolicyInitialization policy_initialization;

  namespace po = boost::program_options;
  po::options_description config("NPGI planner for (Dec)POMDPs \nUsage: " +
                                 std::string(argv[0]) +
                                 " [OPTION]... [DPOMDP-FILE]\nOptions");
  config.add_options()("help", "produce help message")(
      "verbose,v", po::bool_switch()->default_value(false),
      "toggle for verbose output")(
      "horizon,h", po::value<unsigned int>(&horizon)->default_value(3),
      "problem horizon")("policy-width,w",
                         po::value<unsigned int>(&width)->default_value(3),
                         "policy width")(
      "policy-initialization,p",
      po::value<pgi::PolicyInitialization>(&policy_initialization)
          ->default_value(pgi::PolicyInitialization::random),
      "policy initialization type: (random | greedy | blind)")(
      "blind-action,b",
      po::value<std::size_t>(&blind_policy_initial_joint_action)
          ->default_value(0),
      "action for blind policy initialization")(
      "improvement-steps,i",
      po::value<int>(&improvement_steps)->default_value(9),
      "number of policy improvement steps")(
      "use-lower-bound,l", po::bool_switch()->default_value(false),
      "toggle to use lower bound")(
      "use-entropy-reward,e", po::bool_switch()->default_value(false),
      "toggle to use expected posterior entropy as final step reward")(
      "use-sparse,t", po::bool_switch()->default_value(false),
      "toggle to use sparse")(
      "seed,s", po::value<unsigned int>(&rng_seed)->default_value(1234567890),
      "random number seed")("output-prefix,o",
                            po::value<std::string>()->default_value("./"),
                            "output prefix")(
      "max-cache-size,m",
      po::value<std::size_t>(&max_history_cache_size)->default_value(5e7),
      "maximum history cache size");

  po::positional_options_description pp;
  pp.add("dpomdp-file", -1);

  po::options_description hidden("Hidden options");
  hidden.add_options()("dpomdp-file", po::value<std::string>(), "input file");

  po::options_description cmdline_options;
  cmdline_options.add(config).add(hidden);

  po::variables_map vm;
  po::store(po::command_line_parser(argc, argv)
                .options(cmdline_options)
                .positional(pp)
                .run(),
            vm);
  po::notify(vm);
  if (vm.count("help") || argc == 1) {
    std::cout << config << std::endl;
    return 1;
  }
  if (!vm.count("dpomdp-file")) {
    std::cout << "You must specify an input dpomdp file" << std::endl;
    return 1;
  }

  pgi::madpwrapper::MADPDecPOMDPDiscrete madp(
      vm["dpomdp-file"].as<std::string>());
  if (vm["verbose"].as<bool>())
    std::cout << "Loaded problem file " << vm["dpomdp-file"].as<std::string>()
              << std::endl;

  pgi::DecPOMDPDiscrete decpomdp(
      pgi::make_state_space(madp), pgi::make_joint_action_space(madp),
      pgi::make_joint_observation_space(madp),
      pgi::make_transition_matrix(madp, vm["use-sparse"].as<bool>()),
      pgi::make_observation_matrix(madp, vm["use-sparse"].as<bool>()),
      pgi::make_reward_matrix(madp, vm["use-entropy-reward"].as<bool>()));

  pgi::belief_t initial_belief =
      pgi::make_initial_belief(madp, vm["use-sparse"].as<bool>());

  pgi::PRNG rng(rng_seed);

  std::vector<pgi::PolicyGraph> local_policy_graphs;
  const pgi::JointActionSpace& jas = decpomdp.joint_action_space();
  const pgi::JointObservationSpace& jos = decpomdp.joint_observation_space();
  for (std::size_t agent = 0; agent < decpomdp.num_agents(); ++agent) {
    local_policy_graphs.emplace_back(pgi::fixed_width(
        vm["horizon"].as<unsigned int>(), width, jas.num_local_indices(agent),
        jos.num_local_indices(agent)));
  }

  if (policy_initialization == pgi::PolicyInitialization::random) {
    pgi::set_random(local_policy_graphs, rng);
  } else if (policy_initialization == pgi::PolicyInitialization::greedy) {
    pgi::set_open_loop_greedy(local_policy_graphs, initial_belief, decpomdp);
  } else if (policy_initialization == pgi::PolicyInitialization::blind) {
    pgi::set_random(local_policy_graphs,
                    rng);  // to randomize the edges in the policy
    pgi::set_blind(local_policy_graphs, blind_policy_initial_joint_action,
                   decpomdp.joint_action_space());
  }

  if (vm["verbose"].as<bool>())
    std::cout << "Initialized policy using " << policy_initialization
              << " strategy" << std::endl;

  std::ostringstream ss;
  ss << vm["output-prefix"].as<std::string>() << "step" << std::setw(3)
     << std::setfill('0') << 0 << "_";
  write_policy_to_file(local_policy_graphs, ss.str(), decpomdp);

  std::ofstream fvalue(vm["output-prefix"].as<std::string>() +
                       "policy_values.txt");
  std::ofstream ftime(vm["output-prefix"].as<std::string>() +
                      "duration_microseconds.txt");

  pgi::HistoryCache cache(pgi::HistoryData{1.0, 0.0, 0.0, std::move(initial_belief)}, max_history_cache_size);
  pgi::JointPolicy jp(local_policy_graphs);
  double best_value = pgi::value(jp, jp.root(), pgi::History(), decpomdp, cache);
  fvalue << best_value << std::endl;
  std::cout << "Policy value: " << best_value << std::endl;
  std::cout << "Stored " << cache.size() << " histories in cache"
            << std::endl;

  // write initial best policy and value
  for (std::size_t agent = 0; agent < decpomdp.num_agents(); ++agent) {
    std::ofstream fs(vm["output-prefix"].as<std::string>() +
                     "best_policy_agent" + std::to_string(agent) + ".dot");
    print(fs, jp.local_policy(agent),
          pgi::element_names(decpomdp.joint_action_space().get(agent)),
          pgi::element_names(decpomdp.joint_observation_space().get(agent)));
  }

  std::ofstream fs(vm["output-prefix"].as<std::string>() + "best_value.txt");
  fs << best_value << std::endl;

  for (int i = 1; i <= improvement_steps; ++i) {
    std::chrono::high_resolution_clock::time_point t1 =
        std::chrono::high_resolution_clock::now();
    pgi::backpass::BackPassProperties backprops(
        vm["use-lower-bound"].as<bool>());
    auto bp = pgi::backpass::improve(jp, decpomdp, cache, rng, backprops);
    std::chrono::high_resolution_clock::time_point t3 =
        std::chrono::high_resolution_clock::now();
    auto duration =
        std::chrono::duration_cast<std::chrono::microseconds>(t3 - t1).count();
    ftime << duration << std::endl;


    fvalue << bp.improved_policy_value << std::endl;

    if (bp.improved_policy_value > best_value) {
      best_value = bp.improved_policy_value;
      jp = bp.improved_policy;

      // update best policy and value!
      for (std::size_t agent = 0; agent < decpomdp.num_agents(); ++agent) {
        std::ofstream fs(vm["output-prefix"].as<std::string>() +
                         "best_policy_agent" + std::to_string(agent) + ".dot");
        print(fs, jp.local_policy(agent),
              pgi::element_names(decpomdp.joint_action_space().get(agent)),
              pgi::element_names(decpomdp.joint_observation_space().get(agent)));
      }

      std::ofstream fs(vm["output-prefix"].as<std::string>() + "best_value.txt");
      fs << best_value << std::endl;
    }

    std::cout << "Step " << i << " of " << improvement_steps << ": "
              << bp.improved_policy_value << " (best: " << best_value << ")"
              << ", " << duration << " microseconds" << std::endl;

    std::ostringstream ss;
    ss << vm["output-prefix"].as<std::string>() << "/step" << std::setw(3)
       << std::setfill('0') << i << "_";
    write_policy_to_file(jp.local_policies(), ss.str(), decpomdp);

    cache.ensure_size_within_limits();
  }

  return 0;
}